

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

JSON * chaiscript::json::JSONParser::parse_string
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  long lVar1;
  const_reference pvVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c2;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  ulong local_60;
  size_t i;
  char local_41;
  undefined1 local_40 [7];
  char c;
  string val;
  size_t *offset_local;
  string *str_local;
  
  val.field_2._8_8_ = offset;
  std::__cxx11::string::string((string *)local_40);
  lVar1 = *(long *)val.field_2._8_8_;
  *(size_type *)val.field_2._8_8_ = lVar1 + 1U;
  pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     (str,lVar1 + 1U);
  local_41 = *pvVar2;
  do {
    if (local_41 == '\"') {
      *(long *)val.field_2._8_8_ = *(long *)val.field_2._8_8_ + 1;
      std::__cxx11::string::string
                ((string *)&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      JSON::JSON<std::__cxx11::string>(__return_storage_ptr__,&local_e8,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)local_40);
      return __return_storage_ptr__;
    }
    if (local_41 == '\\') {
      lVar1 = *(long *)val.field_2._8_8_;
      *(size_type *)val.field_2._8_8_ = lVar1 + 1U;
      pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (str,lVar1 + 1U);
      switch(*pvVar2) {
      case '\"':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   '\"');
        break;
      default:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   '\\');
        break;
      case '/':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,'/'
                  );
        break;
      case '\\':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   '\\');
        break;
      case 'b':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   '\b');
        break;
      case 'f':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   '\f');
        break;
      case 'n':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   '\n');
        break;
      case 'r':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   '\r');
        break;
      case 't':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   '\t');
        break;
      case 'u':
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "\\u");
        for (local_60 = 1; local_60 < 5; local_60 = local_60 + 1) {
          pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   at(str,*(long *)val.field_2._8_8_ + local_60);
          local_41 = *pvVar2;
          if ((((local_41 < '0') || ('9' < local_41)) && ((local_41 < 'a' || ('f' < local_41)))) &&
             ((local_41 < 'A' || ('F' < local_41)))) {
            local_c2 = 1;
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,
                       "JSON ERROR: String: Expected hex character in unicode escape, found \'",
                       &local_c1);
            std::operator+(&local_a0,&local_c0,local_41);
            std::operator+(&local_80,&local_a0,"\'");
            std::runtime_error::runtime_error(this,(string *)&local_80);
            local_c2 = 0;
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     local_41);
        }
        *(long *)val.field_2._8_8_ = *(long *)val.field_2._8_8_ + 4;
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 local_41);
    }
    lVar1 = *(long *)val.field_2._8_8_;
    *(size_type *)val.field_2._8_8_ = lVar1 + 1U;
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (str,lVar1 + 1U);
    local_41 = *pvVar2;
  } while( true );
}

Assistant:

static JSON parse_string(const std::string &str, size_t &offset) {
      std::string val;
      for (char c = str.at(++offset); c != '\"'; c = str.at(++offset)) {
        if (c == '\\') {
          switch (str.at(++offset)) {
            case '\"':
              val += '\"';
              break;
            case '\\':
              val += '\\';
              break;
            case '/':
              val += '/';
              break;
            case 'b':
              val += '\b';
              break;
            case 'f':
              val += '\f';
              break;
            case 'n':
              val += '\n';
              break;
            case 'r':
              val += '\r';
              break;
            case 't':
              val += '\t';
              break;
            case 'u': {
              val += "\\u";
              for (size_t i = 1; i <= 4; ++i) {
                c = str.at(offset + i);
                if ((c >= '0' && c <= '9') || (c >= 'a' && c <= 'f') || (c >= 'A' && c <= 'F')) {
                  val += c;
                } else {
                  throw std::runtime_error(
                      std::string("JSON ERROR: String: Expected hex character in unicode escape, found '") + c + "'");
                }
              }
              offset += 4;
            } break;
            default:
              val += '\\';
              break;
          }
        } else {
          val += c;
        }
      }
      ++offset;
      return JSON(val);
    }